

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O1

shared_ptr<CommodoreGCRParser::Sector> __thiscall
CommodoreGCRParser::get_next_sector(CommodoreGCRParser *this)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  byte bVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  int max_index_count;
  CommodoreGCRParser *in_RSI;
  size_t c;
  long lVar9;
  shared_ptr<CommodoreGCRParser::Sector> sVar10;
  shared_ptr<CommodoreGCRParser::Sector> sector;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<CommodoreGCRParser::Sector> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x118);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00594908;
  local_48 = (element_type *)(p_Var5 + 1);
  memset(local_48,0,0x104);
  max_index_count = in_RSI->index_count_ + 2;
  local_38 = in_RSI->sector_cache_;
  local_40._M_pi = p_Var5;
LAB_00161a63:
  uVar2 = proceed_to_next_block(in_RSI,max_index_count);
  _Var8._M_pi = extraout_RDX;
  if (uVar2 == 8) {
    uVar2 = get_next_byte(in_RSI);
    uVar3 = get_next_byte(in_RSI);
    local_48->sector = (uint8_t)uVar3;
    uVar3 = get_next_byte(in_RSI);
    local_48->track = (uint8_t)uVar3;
    uVar3 = get_next_byte(in_RSI);
    uVar4 = get_next_byte(in_RSI);
    bVar7 = local_48->track ^ local_48->sector;
    _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),bVar7);
    bVar6 = false;
    if ((uVar2 & 0xff) == ((uVar4 ^ uVar3) & 0xff ^ (uint)bVar7)) {
LAB_00161ad6:
      uVar2 = proceed_to_next_block(in_RSI,max_index_count);
      if (uVar2 != 7) goto code_r0x00161ae5;
      lVar9 = 0;
      _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        uVar2 = get_next_byte(in_RSI);
        (local_48->data)._M_elems[lVar9] = (uchar)uVar2;
        bVar7 = (byte)_Var8._M_pi ^ (local_48->data)._M_elems[lVar9];
        _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)bVar7;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x100);
      uVar2 = get_next_byte(in_RSI);
      bVar6 = false;
      if (uVar2 == bVar7) {
        uVar1._0_1_ = local_48->sector;
        uVar1._1_1_ = local_48->track;
        local_38[uVar1].super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_48;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_38[uVar1].
                    super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,&local_40);
        _Var8._M_pi = local_40._M_pi;
        (this->super_Controller).super_Source._vptr_Source = (_func_int **)local_48;
        (this->super_Controller).super_Source.observer_ = (Observer *)0x0;
        local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->super_Controller).super_Source.observer_ = (Observer *)_Var8._M_pi;
        local_48 = (element_type *)0x0;
        _Var8._M_pi = extraout_RDX_02;
        goto LAB_00161b7b;
      }
    }
    goto LAB_00161b80;
  }
  goto LAB_00161b85;
code_r0x00161ae5:
  if (max_index_count <= in_RSI->index_count_) goto code_r0x00161aee;
  goto LAB_00161ad6;
code_r0x00161aee:
  (this->super_Controller).super_Source._vptr_Source = (_func_int **)0x0;
  (this->super_Controller).super_Source.observer_ = (Observer *)0x0;
  _Var8._M_pi = extraout_RDX_01;
LAB_00161b7b:
  bVar6 = true;
LAB_00161b80:
  if (bVar6) goto LAB_00161b98;
LAB_00161b85:
  if (max_index_count <= in_RSI->index_count_) {
    (this->super_Controller).super_Source._vptr_Source = (_func_int **)0x0;
    (this->super_Controller).super_Source.observer_ = (Observer *)0x0;
LAB_00161b98:
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
      _Var8._M_pi = extraout_RDX_03;
    }
    sVar10.super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var8._M_pi;
    sVar10.super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<CommodoreGCRParser::Sector>)
           sVar10.super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>;
  }
  goto LAB_00161a63;
}

Assistant:

std::shared_ptr<Sector> get_next_sector() {
			auto sector = std::make_shared<Sector>();
			const int max_index_count = index_count_ + 2;

			while(index_count_ < max_index_count) {
				// look for a sector header
				while(1) {
					if(proceed_to_next_block(max_index_count) == 0x08) break;
					if(index_count_ >= max_index_count) return nullptr;
				}

				// get sector details, skip if this looks malformed
				uint8_t checksum = uint8_t(get_next_byte());
				sector->sector = uint8_t(get_next_byte());
				sector->track = uint8_t(get_next_byte());
				uint8_t disk_id[2];
				disk_id[0] = uint8_t(get_next_byte());
				disk_id[1] = uint8_t(get_next_byte());
				if(checksum != (sector->sector ^ sector->track ^ disk_id[0] ^ disk_id[1])) continue;

				// look for the following data
				while(1) {
					if(proceed_to_next_block(max_index_count) == 0x07) break;
					if(index_count_ >= max_index_count) return nullptr;
				}

				checksum = 0;
				for(std::size_t c = 0; c < 256; c++) {
					sector->data[c] = uint8_t(get_next_byte());
					checksum ^= sector->data[c];
				}

				if(checksum == get_next_byte()) {
					uint16_t sector_address = uint16_t((sector->track << 8) | sector->sector);
					sector_cache_[sector_address] = sector;
					return sector;
				}
			}

			return nullptr;
		}